

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_tools.cpp
# Opt level: O2

void dlib::tt::dot_prods(bool add_to,tensor *out,tensor *lhs,tensor *rhs)

{
  undefined7 in_register_00000039;
  matrix_op<dlib::op_pointer_to_mat<float>_> **local_78;
  matrix_op<dlib::op_pointer_to_mat<float>_> *local_70;
  matrix_op<dlib::op_pointer_to_mat<float>_> *local_68;
  matrix_op<dlib::op_pointer_to_mat<float>_> local_60;
  matrix_op<dlib::op_pointer_to_mat<float>_> local_40;
  
  local_70 = &local_40;
  if ((int)CONCAT71(in_register_00000039,add_to) == 0) {
    mat(&local_40,lhs);
    mat(&local_60,rhs);
    local_78 = &local_70;
    local_68 = &local_60;
    tensor::operator=(out,(matrix_exp<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
                           *)&local_78);
  }
  else {
    mat(&local_40,lhs);
    mat(&local_60,rhs);
    local_78 = &local_70;
    local_68 = &local_60;
    tensor::operator+=(out,(matrix_exp<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
                            *)&local_78);
  }
  return;
}

Assistant:

void dot_prods (
        bool add_to,
        tensor& out,
        const tensor& lhs,
        const tensor& rhs
    )
    {
#ifdef DLIB_USE_CUDA
        cuda::dot_prods(add_to, out, lhs, rhs);
#else
        if (add_to)
            out += sum_cols(pointwise_multiply(mat(lhs), mat(rhs))); 
        else
            out = sum_cols(pointwise_multiply(mat(lhs), mat(rhs))); 
#endif
    }